

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primrefgen.cpp
# Opt level: O3

PrimInfo *
embree::avx::createPrimRefArrayMBlur
          (PrimInfo *__return_storage_ptr__,Scene *scene,GTypeMask types,size_t numPrimRefs,
          mvector<PrimRef> *prims,BuildProgressMonitor *progressMonitor,size_t itime)

{
  Geometry *pGVar1;
  Ref<embree::Geometry> *pRVar2;
  undefined1 auVar3 [16];
  intrusive_list_node *piVar4;
  char cVar5;
  int iVar6;
  ulong uVar7;
  task *ptVar8;
  runtime_error *prVar9;
  ulong uVar10;
  ulong uVar11;
  size_t sVar12;
  intrusive_list_node *piVar13;
  long lVar14;
  ulong uVar15;
  size_t sVar16;
  _func_int **pp_Var17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  _func_int **pp_Var21;
  ulong uVar22;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar23;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar24;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar25;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar26;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar27;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar28;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar29;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar30;
  size_t taskCount;
  Iterator2 iter;
  task_group_context context;
  ParallelForForPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> pstate;
  undefined1 local_2dd9;
  _func_int **local_2dd8;
  long **local_2dd0;
  task_traits local_2dc8;
  mvector<PrimRef> *local_2dc0;
  Scene **local_2db8;
  BuildProgressMonitor *local_2db0;
  size_t local_2da8;
  mvector<PrimRef> **local_2da0;
  Scene **local_2d98;
  Scene *local_2d90;
  GTypeMask local_2d88;
  undefined1 local_2d80;
  mvector<PrimRef> *local_2d78;
  size_t *local_2d70;
  undefined4 local_2d68;
  undefined4 uStack_2d64;
  undefined4 uStack_2d60;
  undefined4 uStack_2d5c;
  undefined4 local_2d58;
  undefined4 uStack_2d54;
  undefined4 uStack_2d50;
  undefined4 uStack_2d4c;
  undefined4 local_2d48;
  undefined4 uStack_2d44;
  undefined4 uStack_2d40;
  undefined4 uStack_2d3c;
  undefined4 local_2d38;
  undefined4 uStack_2d34;
  undefined4 uStack_2d30;
  undefined4 uStack_2d2c;
  intrusive_list_node local_2d28;
  long *local_2d18;
  _func_int ***local_2d10;
  undefined4 *local_2d08;
  Scene ***local_2d00;
  undefined1 *local_2cf8;
  mvector<PrimRef> ***local_2cf0;
  undefined8 local_2ce8;
  undefined4 local_2ce0;
  wait_context local_2cd8;
  task_group_context local_2cc8;
  long local_2c48 [64];
  ulong local_2a48 [64];
  _func_int **local_2848;
  ulong local_2840;
  intrusive_list_node local_13f8 [316];
  
  local_2848 = (_func_int **)0x0;
  local_2d80 = 1;
  uVar15 = 0;
  local_2dc0 = prims;
  local_2db0 = progressMonitor;
  local_2da8 = numPrimRefs;
  local_2d90 = scene;
  local_2d88 = types;
  (**progressMonitor->_vptr_BuildProgressMonitor)();
  sVar12 = (scene->geometries).size_active;
  if (sVar12 != 0) {
    uVar15 = 0;
    sVar16 = 0;
    do {
      pGVar1 = (scene->geometries).items[sVar16].ptr;
      if ((((pGVar1 == (Geometry *)0x0) || (((uint)pGVar1->field_8 >> 0x15 & 1) == 0)) ||
          ((1 << (SUB41(pGVar1->field_8,0) & 0x1f) & types) == ~MTY_ALL)) ||
         (pGVar1->numTimeSteps == 1)) {
        uVar10 = 0;
      }
      else {
        uVar10 = (ulong)pGVar1->numPrimitives;
      }
      uVar15 = uVar15 + uVar10;
      sVar16 = sVar16 + 1;
    } while (sVar12 != sVar16);
  }
  local_2840 = uVar15;
  iVar6 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
  uVar10 = uVar15 + 0x3ff >> 10;
  if ((ulong)(long)iVar6 < uVar10) {
    uVar10 = (long)iVar6;
  }
  uVar20 = 0x40;
  if (uVar10 < 0x40) {
    uVar20 = uVar10;
  }
  pp_Var21 = (_func_int **)(uVar20 + (uVar20 == 0));
  local_2c48[0] = 0;
  local_2a48[0] = 0;
  local_2848 = pp_Var21;
  if (1 < uVar10) {
    uVar20 = 0;
    uVar10 = uVar15 / (ulong)pp_Var21;
    pRVar2 = (scene->geometries).items;
    pp_Var17 = (_func_int **)0x1;
    lVar18 = 0;
    do {
      pGVar1 = pRVar2[lVar18].ptr;
      if (((pGVar1 == (Geometry *)0x0) || (((uint)pGVar1->field_8 >> 0x15 & 1) == 0)) ||
         (((1 << (SUB41(pGVar1->field_8,0) & 0x1f) & types) == ~MTY_ALL ||
          ((pGVar1->numTimeSteps == 1 || (uVar19 = (ulong)pGVar1->numPrimitives, uVar19 == 0)))))) {
        uVar19 = 0;
        lVar14 = 0;
      }
      else {
        uVar11 = ((long)pp_Var17 + 1) * uVar15;
        lVar14 = 0;
        uVar22 = 0;
        do {
          uVar7 = uVar10;
          uVar10 = uVar7;
          if ((uVar20 + uVar19 + lVar14 < uVar7) || (pp_Var21 <= pp_Var17)) break;
          local_2c48[(long)pp_Var17] = lVar18;
          uVar22 = uVar22 + (uVar7 - uVar20);
          local_2a48[(long)pp_Var17] = uVar22;
          pp_Var17 = (_func_int **)((long)pp_Var17 + 1);
          uVar10 = uVar11 / (ulong)local_2848;
          lVar14 = -uVar22;
          uVar11 = uVar11 + uVar15;
          uVar20 = uVar7;
          pp_Var21 = local_2848;
        } while (uVar22 < uVar19);
      }
      uVar20 = uVar19 + uVar20 + lVar14;
      lVar18 = lVar18 + 1;
    } while (pp_Var17 < pp_Var21);
  }
  local_2d68 = 0x7f800000;
  uStack_2d64 = 0x7f800000;
  uStack_2d60 = 0x7f800000;
  uStack_2d5c = 0x7f800000;
  local_2d58 = 0xff800000;
  uStack_2d54 = 0xff800000;
  uStack_2d50 = 0xff800000;
  uStack_2d4c = 0xff800000;
  local_2d48 = 0x7f800000;
  uStack_2d44 = 0x7f800000;
  uStack_2d40 = 0x7f800000;
  uStack_2d3c = 0x7f800000;
  local_2d38 = 0xff800000;
  uStack_2d34 = 0xff800000;
  uStack_2d30 = 0xff800000;
  uStack_2d2c = 0xff800000;
  local_2d28 = (intrusive_list_node)(ZEXT816(0) << 0x20);
  local_2d78 = local_2dc0;
  local_2d70 = &itime;
  local_2db8 = &local_2d90;
  local_2d00 = &local_2db8;
  local_2cf0 = &local_2da0;
  local_2d10 = &local_2dd8;
  local_2d18 = local_2c48;
  local_2cf8 = &local_2dd9;
  local_2cc8.my_version = proxy_support;
  local_2cc8.my_traits = (context_traits)0x4;
  local_2cc8.my_name = CUSTOM_CTX;
  local_2dd8 = pp_Var21;
  local_2da0 = &local_2d78;
  local_2d98 = local_2db8;
  local_2d08 = &local_2d68;
  local_2cc8.my_node = local_2d28;
  tbb::detail::r1::initialize(&local_2cc8);
  local_2dc8.m_version_and_traits = 0;
  local_2dd0 = &local_2d18;
  ptVar8 = (task *)tbb::detail::r1::allocate((small_object_pool **)&local_2dc8,0xc0);
  ptVar8->m_reserved[2] = 0;
  ptVar8->m_reserved[3] = 0;
  ptVar8->m_reserved[4] = 0;
  ptVar8->m_reserved[5] = 0;
  (ptVar8->super_task_traits).m_version_and_traits = 0;
  ptVar8->m_reserved[0] = 0;
  ptVar8->m_reserved[1] = 0;
  ptVar8->m_reserved[2] = 0;
  ptVar8->_vptr_task = (_func_int **)&PTR__task_0219f258;
  ptVar8[1]._vptr_task = pp_Var21;
  ptVar8[1].super_task_traits.m_version_and_traits = 0;
  ptVar8[1].m_reserved[0] = 1;
  ptVar8[1].m_reserved[1] = (uint64_t)&local_2dd0;
  ptVar8[1].m_reserved[2] = 0;
  ptVar8[1].m_reserved[3] = 1;
  iVar6 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
  *(undefined4 *)&ptVar8[2]._vptr_task = 0;
  *(undefined1 *)((long)&ptVar8[2]._vptr_task + 4) = 5;
  ptVar8[1].m_reserved[5] = (long)iVar6 * 2 & 0x7ffffffffffffffe;
  ptVar8[2].super_task_traits.m_version_and_traits = local_2dc8.m_version_and_traits;
  local_2ce8 = 0;
  local_2ce0 = 1;
  local_2cd8.m_version_and_traits = 1;
  local_2cd8.m_ref_count.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)1;
  ptVar8[1].m_reserved[4] = (uint64_t)&local_2ce8;
  tbb::detail::r1::execute_and_wait(ptVar8,&local_2cc8,&local_2cd8,&local_2cc8);
  cVar5 = tbb::detail::r1::is_group_execution_cancelled(&local_2cc8);
  if (cVar5 != '\0') {
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar9,"task cancelled");
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::r1::destroy(&local_2cc8);
  aVar23.m128[1] = (float)uStack_2d64;
  aVar23.m128[0] = (float)local_2d68;
  aVar23.m128[2] = (float)uStack_2d60;
  aVar23.m128[3] = (float)uStack_2d5c;
  aVar25.m128[1] = (float)uStack_2d54;
  aVar25.m128[0] = (float)local_2d58;
  aVar25.m128[2] = (float)uStack_2d50;
  aVar25.m128[3] = (float)uStack_2d4c;
  aVar27.m128[1] = (float)uStack_2d44;
  aVar27.m128[0] = (float)local_2d48;
  aVar27.m128[2] = (float)uStack_2d40;
  aVar27.m128[3] = (float)uStack_2d3c;
  aVar29.m128[1] = (float)uStack_2d34;
  aVar29.m128[0] = (float)local_2d38;
  aVar29.m128[2] = (float)uStack_2d30;
  aVar29.m128[3] = (float)uStack_2d2c;
  __return_storage_ptr__->begin = (size_t)local_2d28.my_prev_node;
  __return_storage_ptr__->end = (size_t)local_2d28.my_next_node;
  if (local_2dd8 == (_func_int **)0x0) {
    sVar12 = __return_storage_ptr__->begin;
    sVar16 = __return_storage_ptr__->end;
  }
  else {
    auVar3._0_8_ = __return_storage_ptr__->begin;
    auVar3._8_8_ = __return_storage_ptr__->end;
    piVar13 = local_13f8;
    pp_Var21 = local_2dd8;
    do {
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(piVar13 + -4) = aVar23;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(piVar13 + -3) = aVar25;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(piVar13 + -2) = aVar27;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(piVar13 + -1) = aVar29;
      piVar4 = (intrusive_list_node *)__return_storage_ptr__->end;
      piVar13->my_prev_node = (intrusive_list_node *)__return_storage_ptr__->begin;
      piVar13->my_next_node = piVar4;
      aVar23.m128 = (__m128)vminps_avx(aVar23.m128,(undefined1  [16])piVar13[-0x144]);
      aVar25.m128 = (__m128)vmaxps_avx(aVar25.m128,(undefined1  [16])piVar13[-0x143]);
      aVar27.m128 = (__m128)vminps_avx(aVar27.m128,(undefined1  [16])piVar13[-0x142]);
      aVar29.m128 = (__m128)vmaxps_avx(aVar29.m128,(undefined1  [16])piVar13[-0x141]);
      auVar3 = vpaddq_avx(auVar3,(undefined1  [16])piVar13[-0x140]);
      sVar12 = auVar3._0_8_;
      __return_storage_ptr__->begin = auVar3._0_8_;
      __return_storage_ptr__->end = auVar3._8_8_;
      piVar13 = piVar13 + 5;
      pp_Var21 = (_func_int **)((long)pp_Var21 + -1);
    } while (pp_Var21 != (_func_int **)0x0);
    sVar16 = vpextrq_avx(auVar3,1);
  }
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar23;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar25;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar27;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar29;
  if (sVar16 - sVar12 != local_2da8) {
    (**local_2db0->_vptr_BuildProgressMonitor)(local_2db0,0);
    pp_Var21 = local_2848;
    local_2d68 = 0x7f800000;
    uStack_2d64 = 0x7f800000;
    uStack_2d60 = 0x7f800000;
    uStack_2d5c = 0x7f800000;
    local_2d58 = 0xff800000;
    uStack_2d54 = 0xff800000;
    uStack_2d50 = 0xff800000;
    uStack_2d4c = 0xff800000;
    local_2d48 = 0x7f800000;
    uStack_2d44 = 0x7f800000;
    uStack_2d40 = 0x7f800000;
    uStack_2d3c = 0x7f800000;
    local_2d38 = 0xff800000;
    uStack_2d34 = 0xff800000;
    uStack_2d30 = 0xff800000;
    uStack_2d2c = 0xff800000;
    local_2d28 = (intrusive_list_node)(ZEXT816(0) << 0x20);
    local_2d78 = local_2dc0;
    local_2d70 = &itime;
    local_2db8 = &local_2d90;
    local_2dd8 = local_2848;
    local_2d18 = local_2c48;
    local_2d10 = &local_2dd8;
    local_2d00 = &local_2db8;
    local_2cf8 = &local_2dd9;
    local_2cf0 = &local_2da0;
    local_2cc8.my_version = proxy_support;
    local_2cc8.my_traits = (context_traits)0x4;
    local_2cc8.my_name = CUSTOM_CTX;
    local_2da0 = &local_2d78;
    local_2d98 = local_2db8;
    local_2d08 = &local_2d68;
    local_2cc8.my_node = local_2d28;
    tbb::detail::r1::initialize(&local_2cc8);
    local_2dd0 = &local_2d18;
    if (pp_Var21 != (_func_int **)0x0) {
      local_2dc8.m_version_and_traits = 0;
      ptVar8 = (task *)tbb::detail::r1::allocate((small_object_pool **)&local_2dc8,0xc0);
      ptVar8->m_reserved[2] = 0;
      ptVar8->m_reserved[3] = 0;
      ptVar8->m_reserved[4] = 0;
      ptVar8->m_reserved[5] = 0;
      (ptVar8->super_task_traits).m_version_and_traits = 0;
      ptVar8->m_reserved[0] = 0;
      ptVar8->m_reserved[1] = 0;
      ptVar8->m_reserved[2] = 0;
      ptVar8->_vptr_task = (_func_int **)&PTR__task_0219f2a0;
      ptVar8[1]._vptr_task = pp_Var21;
      ptVar8[1].super_task_traits.m_version_and_traits = 0;
      ptVar8[1].m_reserved[0] = 1;
      ptVar8[1].m_reserved[1] = (uint64_t)&local_2dd0;
      ptVar8[1].m_reserved[2] = 0;
      ptVar8[1].m_reserved[3] = 1;
      iVar6 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
      *(undefined4 *)&ptVar8[2]._vptr_task = 0;
      *(undefined1 *)((long)&ptVar8[2]._vptr_task + 4) = 5;
      ptVar8[1].m_reserved[5] = (long)iVar6 * 2 & 0x7ffffffffffffffe;
      ptVar8[2].super_task_traits.m_version_and_traits = local_2dc8.m_version_and_traits;
      local_2ce8 = 0;
      local_2ce0 = 1;
      local_2cd8.m_version_and_traits = 1;
      local_2cd8.m_ref_count.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)1;
      ptVar8[1].m_reserved[4] = (uint64_t)&local_2ce8;
      tbb::detail::r1::execute_and_wait(ptVar8,&local_2cc8,&local_2cd8,&local_2cc8);
    }
    cVar5 = tbb::detail::r1::is_group_execution_cancelled(&local_2cc8);
    if (cVar5 != '\0') {
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar9,"task cancelled");
      __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(&local_2cc8);
    aVar30.m128[1] = (float)uStack_2d64;
    aVar30.m128[0] = (float)local_2d68;
    aVar30.m128[2] = (float)uStack_2d60;
    aVar30.m128[3] = (float)uStack_2d5c;
    aVar28.m128[1] = (float)uStack_2d54;
    aVar28.m128[0] = (float)local_2d58;
    aVar28.m128[2] = (float)uStack_2d50;
    aVar28.m128[3] = (float)uStack_2d4c;
    aVar26.m128[1] = (float)uStack_2d44;
    aVar26.m128[0] = (float)local_2d48;
    aVar26.m128[2] = (float)uStack_2d40;
    aVar26.m128[3] = (float)uStack_2d3c;
    aVar24.m128[1] = (float)uStack_2d34;
    aVar24.m128[0] = (float)local_2d38;
    aVar24.m128[2] = (float)uStack_2d30;
    aVar24.m128[3] = (float)uStack_2d2c;
    if (local_2dd8 != (_func_int **)0x0) {
      piVar13 = local_13f8;
      do {
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(piVar13 + -4) = aVar30;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(piVar13 + -3) = aVar28;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(piVar13 + -2) = aVar26;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(piVar13 + -1) = aVar24;
        *piVar13 = local_2d28;
        aVar30.m128 = (__m128)vminps_avx(aVar30.m128,(undefined1  [16])piVar13[-0x144]);
        aVar28.m128 = (__m128)vmaxps_avx(aVar28.m128,(undefined1  [16])piVar13[-0x143]);
        aVar26.m128 = (__m128)vminps_avx(aVar26.m128,(undefined1  [16])piVar13[-0x142]);
        aVar24.m128 = (__m128)vmaxps_avx(aVar24.m128,(undefined1  [16])piVar13[-0x141]);
        local_2d28 = (intrusive_list_node)
                     vpaddq_avx((undefined1  [16])local_2d28,(undefined1  [16])piVar13[-0x140]);
        piVar13 = piVar13 + 5;
        local_2dd8 = (_func_int **)((long)local_2dd8 + -1);
      } while (local_2dd8 != (_func_int **)0x0);
    }
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
         = aVar30;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
         = aVar28;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
         = aVar26;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
         = aVar24;
    __return_storage_ptr__->begin = (size_t)local_2d28.my_prev_node;
    __return_storage_ptr__->end = (size_t)local_2d28.my_next_node;
  }
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArrayMBlur(Scene* scene, Geometry::GTypeMask types, const size_t numPrimRefs, mvector<PrimRef>& prims, BuildProgressMonitor& progressMonitor, size_t itime)
    {
      ParallelForForPrefixSumState<PrimInfo> pstate;
      Scene::Iterator2 iter(scene,types,true);
      
      /* first try */
      progressMonitor(0);
      pstate.init(iter,size_t(1024));
      PrimInfo pinfo = parallel_for_for_prefix_sum0( pstate, iter, PrimInfo(empty), [&](Geometry* mesh, const range<size_t>& r, size_t k, size_t geomID) -> PrimInfo {
          return mesh->createPrimRefArrayMB(prims,itime,r,k,(unsigned)geomID);
        }, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo::merge(a,b); });
      
      /* if we need to filter out geometry, run again */
      if (pinfo.size() != numPrimRefs)
      {
        progressMonitor(0);
        pinfo = parallel_for_for_prefix_sum1( pstate, iter, PrimInfo(empty), [&](Geometry* mesh, const range<size_t>& r, size_t k, size_t geomID, const PrimInfo& base) -> PrimInfo {
            return mesh->createPrimRefArrayMB(prims,itime,r,base.size(),(unsigned)geomID);
          }, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo::merge(a,b); });
      }
      return pinfo;
    }